

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O0

nsync_time nsync_note_notified_deadline_(nsync_note n)

{
  nsync_time a;
  nsync_time nVar1;
  uint32_t uVar2;
  int iVar3;
  nsync_time nVar4;
  nsync_note n_local;
  nsync_time ntime;
  
  uVar2 = atm_load_acq_u32_(&n->notified);
  if (uVar2 == 0) {
    nsync_mu_lock(&n->note_mu);
    uVar2 = atm_load_acq_u32_(&n->notified);
    if (uVar2 == 0) {
      if (n->expiry_time_valid == 0) {
        n_local = (nsync_note)0x7fffffffffffffff;
        ntime.tv_sec = 999999999;
      }
      else {
        n_local = (nsync_note)(n->expiry_time).tv_sec;
        ntime.tv_sec = (n->expiry_time).tv_nsec;
      }
    }
    else {
      n_local = (nsync_note)0;
      ntime.tv_sec = 0;
    }
    nsync_mu_unlock(&n->note_mu);
    nVar4.tv_nsec = ntime.tv_sec;
    nVar4.tv_sec = (__time_t)n_local;
    iVar3 = nsync_time_cmp(nVar4,(nsync_time)ZEXT816((ulong)0));
    if (0 < iVar3) {
      nVar4 = nsync_time_now();
      a.tv_nsec = ntime.tv_sec;
      a.tv_sec = (__time_t)n_local;
      iVar3 = nsync_time_cmp(a,nVar4);
      if (iVar3 < 1) {
        notify(n);
        n_local = (nsync_note)0;
        ntime.tv_sec = 0;
      }
    }
  }
  else {
    n_local = (nsync_note)0;
    ntime.tv_sec = 0;
  }
  nVar1.tv_nsec = ntime.tv_sec;
  nVar1.tv_sec = (__time_t)n_local;
  return nVar1;
}

Assistant:

nsync_time nsync_note_notified_deadline_ (nsync_note n) {
	nsync_time ntime;
	if (ATM_LOAD_ACQ (&n->notified) != 0) {
		ntime = nsync_time_zero;
	} else {
		nsync_mu_lock (&n->note_mu);
		ntime = NOTIFIED_TIME (n);
		nsync_mu_unlock (&n->note_mu);
		if (nsync_time_cmp (ntime, nsync_time_zero) > 0) {
			if (nsync_time_cmp (ntime, nsync_time_now ()) <= 0) {
				notify (n);
				ntime = nsync_time_zero;
			}
		}
	}
	return (ntime);
}